

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::AppendPolygon(Clipper *this,TEdge *e1,TEdge *e2)

{
  int iVar1;
  int iVar2;
  pointer ppOVar3;
  OutRec *outRec1;
  OutRec *outRec2;
  OutPt *pOVar4;
  OutPt *pOVar5;
  OutPt *pOVar6;
  OutPt *pOVar7;
  JoinRec *pJVar8;
  OutRec *pOVar9;
  OutRec *pOVar10;
  OutRec *pOVar11;
  OutPt *pOVar12;
  EdgeSide EVar13;
  ulong uVar14;
  TEdge *pTVar15;
  pointer ppJVar16;
  pointer ppHVar17;
  OutPt *pOVar18;
  
  ppOVar3 = (this->m_PolyOuts).
            super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  outRec1 = ppOVar3[e1->outIdx];
  outRec2 = ppOVar3[e2->outIdx];
  pOVar10 = outRec1;
  do {
    pOVar10 = pOVar10->FirstLeft;
    if (pOVar10 == outRec2) break;
  } while (pOVar10 != (OutRec *)0x0);
  pOVar9 = outRec2;
  pOVar11 = outRec2;
  if (pOVar10 != outRec2) {
    do {
      pOVar11 = pOVar11->FirstLeft;
      if (pOVar11 == outRec1) break;
    } while (pOVar11 != (OutRec *)0x0);
    pOVar9 = outRec1;
    if (pOVar11 != outRec1) {
      pOVar9 = GetLowermostRec(outRec1,outRec2);
    }
  }
  pOVar4 = outRec1->pts;
  pOVar5 = pOVar4->prev;
  pOVar12 = outRec2->pts;
  pOVar6 = pOVar12->prev;
  if (e1->side == esLeft) {
    pOVar18 = pOVar12;
    if (e2->side == esLeft) {
      do {
        pOVar7 = pOVar18->next;
        pOVar18->next = pOVar18->prev;
        pOVar18->prev = pOVar7;
        pOVar18 = pOVar7;
      } while (pOVar7 != pOVar12);
      pOVar12->next = pOVar4;
      pOVar4->prev = pOVar12;
      pOVar5->next = pOVar6;
      pOVar6->prev = pOVar5;
      pOVar12 = pOVar6;
    }
    else {
      pOVar6->next = pOVar4;
      pOVar4->prev = pOVar6;
      pOVar12->prev = pOVar5;
      pOVar5->next = pOVar12;
    }
    outRec1->pts = pOVar12;
    EVar13 = esLeft;
  }
  else {
    pOVar18 = pOVar12;
    if (e2->side == esRight) {
      do {
        pOVar7 = pOVar18->next;
        pOVar18->next = pOVar18->prev;
        pOVar18->prev = pOVar7;
        pOVar18 = pOVar7;
      } while (pOVar7 != pOVar12);
      pOVar5->next = pOVar6;
      pOVar6->prev = pOVar5;
      pOVar12->next = pOVar4;
      pOVar4->prev = pOVar12;
    }
    else {
      pOVar5->next = pOVar12;
      pOVar12->prev = pOVar5;
      pOVar4->prev = pOVar6;
      pOVar6->next = pOVar4;
    }
    EVar13 = esRight;
  }
  if (pOVar9 == outRec2) {
    pOVar4 = outRec2->bottomPt;
    outRec1->bottomPt = pOVar4;
    pOVar4->idx = outRec1->idx;
    if (outRec2->FirstLeft != outRec1) {
      outRec1->FirstLeft = outRec2->FirstLeft;
    }
    outRec1->isHole = outRec2->isHole;
  }
  outRec2->pts = (OutPt *)0x0;
  outRec2->bottomPt = (OutPt *)0x0;
  outRec2->AppendLink = outRec1;
  iVar1 = e1->outIdx;
  iVar2 = e2->outIdx;
  e1->outIdx = -1;
  e2->outIdx = -1;
  pTVar15 = this->m_ActiveEdges;
  do {
    if (pTVar15 == (TEdge *)0x0) {
LAB_0065c523:
      ppJVar16 = (this->m_Joins).
                 super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if ((this->m_Joins).
          super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppJVar16) {
        uVar14 = 0;
        do {
          if (ppJVar16[uVar14]->poly1Idx == iVar2) {
            ppJVar16[uVar14]->poly1Idx = iVar1;
          }
          pJVar8 = (this->m_Joins).
                   super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar14];
          if (pJVar8->poly2Idx == iVar2) {
            pJVar8->poly2Idx = iVar1;
          }
          uVar14 = uVar14 + 1;
          ppJVar16 = (this->m_Joins).
                     super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar14 < (ulong)((long)(this->m_Joins).
                                        super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppJVar16
                                 >> 3));
      }
      ppHVar17 = (this->m_HorizJoins).
                 super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((this->m_HorizJoins).
          super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppHVar17) {
        uVar14 = 0;
        do {
          if (ppHVar17[uVar14]->savedIdx == iVar2) {
            ppHVar17[uVar14]->savedIdx = iVar1;
          }
          uVar14 = uVar14 + 1;
          ppHVar17 = (this->m_HorizJoins).
                     super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar14 < (ulong)((long)(this->m_HorizJoins).
                                        super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppHVar17
                                 >> 3));
      }
      return;
    }
    if (pTVar15->outIdx == iVar2) {
      pTVar15->outIdx = iVar1;
      pTVar15->side = EVar13;
      goto LAB_0065c523;
    }
    pTVar15 = pTVar15->nextInAEL;
  } while( true );
}

Assistant:

void Clipper::AppendPolygon(TEdge *e1, TEdge *e2)
{
  //get the start and ends of both output polygons ...
  OutRec *outRec1 = m_PolyOuts[e1->outIdx];
  OutRec *outRec2 = m_PolyOuts[e2->outIdx];

  OutRec *holeStateRec;
  if (Param1RightOfParam2(outRec1, outRec2)) holeStateRec = outRec2;
  else if (Param1RightOfParam2(outRec2, outRec1)) holeStateRec = outRec1;
  else holeStateRec = GetLowermostRec(outRec1, outRec2);

  OutPt* p1_lft = outRec1->pts;
  OutPt* p1_rt = p1_lft->prev;
  OutPt* p2_lft = outRec2->pts;
  OutPt* p2_rt = p2_lft->prev;

  EdgeSide side;
  //join e2 poly onto e1 poly and delete pointers to e2 ...
  if(  e1->side == esLeft )
  {
    if(  e2->side == esLeft )
    {
      //z y x a b c
      ReversePolyPtLinks(*p2_lft);
      p2_lft->next = p1_lft;
      p1_lft->prev = p2_lft;
      p1_rt->next = p2_rt;
      p2_rt->prev = p1_rt;
      outRec1->pts = p2_rt;
    } else
    {
      //x y z a b c
      p2_rt->next = p1_lft;
      p1_lft->prev = p2_rt;
      p2_lft->prev = p1_rt;
      p1_rt->next = p2_lft;
      outRec1->pts = p2_lft;
    }
    side = esLeft;
  } else
  {
    if(  e2->side == esRight )
    {
      //a b c z y x
      ReversePolyPtLinks( *p2_lft );
      p1_rt->next = p2_rt;
      p2_rt->prev = p1_rt;
      p2_lft->next = p1_lft;
      p1_lft->prev = p2_lft;
    } else
    {
      //a b c x y z
      p1_rt->next = p2_lft;
      p2_lft->prev = p1_rt;
      p1_lft->prev = p2_rt;
      p2_rt->next = p1_lft;
    }
    side = esRight;
  }

  if (holeStateRec == outRec2)
  {
    outRec1->bottomPt = outRec2->bottomPt;
    outRec1->bottomPt->idx = outRec1->idx;
    if (outRec2->FirstLeft != outRec1)
      outRec1->FirstLeft = outRec2->FirstLeft;
    outRec1->isHole = outRec2->isHole;
  }
  outRec2->pts = 0;
  outRec2->bottomPt = 0;
  outRec2->AppendLink = outRec1;
  int OKIdx = e1->outIdx;
  int ObsoleteIdx = e2->outIdx;

  e1->outIdx = -1; //nb: safe because we only get here via AddLocalMaxPoly
  e2->outIdx = -1;

  TEdge* e = m_ActiveEdges;
  while( e )
  {
    if( e->outIdx == ObsoleteIdx )
    {
      e->outIdx = OKIdx;
      e->side = side;
      break;
    }
    e = e->nextInAEL;
  }

  for (JoinList::size_type i = 0; i < m_Joins.size(); ++i)
  {
      if (m_Joins[i]->poly1Idx == ObsoleteIdx) m_Joins[i]->poly1Idx = OKIdx;
      if (m_Joins[i]->poly2Idx == ObsoleteIdx) m_Joins[i]->poly2Idx = OKIdx;
  }

  for (HorzJoinList::size_type i = 0; i < m_HorizJoins.size(); ++i)
  {
      if (m_HorizJoins[i]->savedIdx == ObsoleteIdx)
        m_HorizJoins[i]->savedIdx = OKIdx;
  }

}